

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcore_address.cpp
# Opt level: O1

NetType_conflict __thiscall cfd::core::AddressFormatData::GetNetType(AddressFormatData *this)

{
  int iVar1;
  NetType_conflict NVar2;
  string net_type;
  string local_58;
  string local_38;
  
  local_38._M_dataplus._M_p = (pointer)&local_38.field_2;
  ::std::__cxx11::string::_M_construct<char_const*>((string *)&local_38,"nettype","");
  GetString(&local_58,this,&local_38);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_38._M_dataplus._M_p != &local_38.field_2) {
    operator_delete(local_38._M_dataplus._M_p);
  }
  iVar1 = ::std::__cxx11::string::compare((char *)&local_58);
  if (iVar1 == 0) {
    NVar2 = kCfdSuccess;
  }
  else {
    iVar1 = ::std::__cxx11::string::compare((char *)&local_58);
    if (iVar1 == 0) {
      NVar2 = kCfdIllegalArgumentError;
    }
    else {
      iVar1 = ::std::__cxx11::string::compare((char *)&local_58);
      if (iVar1 == 0) {
        NVar2 = kCfdIllegalStateError;
      }
      else {
        iVar1 = ::std::__cxx11::string::compare((char *)&local_58);
        if (iVar1 == 0) {
          NVar2 = kCfdOutOfRangeError;
        }
        else {
          iVar1 = ::std::__cxx11::string::compare((char *)&local_58);
          NVar2 = kCfdConnectionError - (uint)(iVar1 == 0);
        }
      }
    }
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_58._M_dataplus._M_p != &local_58.field_2) {
    operator_delete(local_58._M_dataplus._M_p);
  }
  return NVar2;
}

Assistant:

NetType AddressFormatData::GetNetType() const {
  std::string net_type = GetString(kNettype);
  NetType result = NetType::kCustomChain;
  if (net_type == kNettypeMainnet) {
    result = NetType::kMainnet;
  } else if (net_type == kNettypeTestnet) {
    result = NetType::kTestnet;
  } else if (net_type == kNettypeRegtest) {
    result = NetType::kRegtest;
  } else {
#ifndef CFD_DISABLE_ELEMENTS
    if (net_type == kNettypeLiquidV1) {
      result = NetType::kLiquidV1;
    } else if (net_type == kNettypeElementsRegtest) {
      result = NetType::kElementsRegtest;
    }
#endif  // CFD_DISABLE_ELEMENTS
  }
  return result;
}